

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O1

void nn_aipc_term(nn_aipc *self)

{
  if (self->state == 1) {
    nn_list_item_term(&self->item);
    nn_fsm_event_term(&self->done);
    nn_fsm_event_term(&self->accepted);
    nn_sipc_term(&self->sipc);
    nn_usock_term(&self->usock);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_aipc_term_cold_1();
}

Assistant:

void nn_aipc_term (struct nn_aipc *self)
{
    nn_assert_state (self, NN_AIPC_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_sipc_term (&self->sipc);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}